

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

JitProfilingInstr *
IR::JitProfilingInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Opnd *src2Opnd,Func *func)

{
  JitProfilingInstr *this;
  
  this = New(opcode,dstOpnd,src1Opnd,func);
  Instr::SetSrc2(&this->super_Instr,src2Opnd);
  return this;
}

Assistant:

JitProfilingInstr *
JitProfilingInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Opnd *src2Opnd, Func * func)
{
    JitProfilingInstr * profiledInstr = JitProfilingInstr::New(opcode, dstOpnd, src1Opnd, func);
    profiledInstr->SetSrc2(src2Opnd);

    return profiledInstr;
}